

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
tf::detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (uint *begin,uint *end,uint *param_3)

{
  uint *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  int __tmp;
  ulong uVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  ulong uVar17;
  bool bVar18;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar19;
  uchar offsets_l_storage [128];
  uint *local_180;
  byte local_101 [128];
  byte abStack_81 [81];
  
  uVar4 = *begin;
  lVar7 = 0;
  do {
    uVar5 = *(uint *)((long)begin + lVar7 + 4);
    lVar7 = lVar7 + 4;
  } while ((int)uVar5 < (int)uVar4);
  puVar1 = (uint *)((long)begin + lVar7);
  puVar14 = end;
  if (lVar7 == 4) {
    do {
      if (end <= puVar1) break;
      puVar14 = end + -1;
      puVar13 = end + -1;
      end = puVar14;
    } while ((int)uVar4 <= (int)*puVar13);
  }
  else {
    do {
      end = puVar14 + -1;
      puVar13 = puVar14 + -1;
      puVar14 = end;
    } while ((int)uVar4 <= (int)*puVar13);
  }
  puVar14 = puVar1;
  if (puVar1 < end) {
    param_3 = (uint *)(ulong)*end;
    puVar14 = (uint *)((long)begin + lVar7) + 1;
    *(uint *)((long)begin + lVar7) = *end;
    *end = uVar5;
    if (puVar14 < end) {
      pbVar10 = local_101 + 1;
      lVar7 = 0;
      param_3 = (uint *)0x0;
      uVar17 = 0;
      puVar13 = end;
      puVar16 = puVar14;
      uVar11 = 0;
      local_180 = end;
      do {
        uVar8 = (long)puVar13 - (long)puVar14 >> 2;
        uVar9 = uVar8 >> (uVar17 == 0);
        if (uVar11 != 0) {
          uVar9 = 0;
        }
        uVar8 = uVar8 - uVar9;
        if (uVar17 != 0) {
          uVar8 = 0;
        }
        if (uVar9 < 0x40) {
          if (uVar9 != 0) {
            bVar6 = 0;
            do {
              abStack_81[uVar11 + 1] = bVar6;
              bVar6 = bVar6 + 1;
              uVar11 = uVar11 + ((int)uVar4 <= (int)*puVar14);
              puVar14 = puVar14 + 1;
            } while (bVar6 < (byte)uVar9);
          }
        }
        else {
          bVar6 = 0;
          do {
            abStack_81[uVar11 + 1] = bVar6;
            lVar12 = ((int)uVar4 <= (int)*puVar14) + uVar11;
            abStack_81[lVar12 + 1] = bVar6 + 1;
            lVar12 = (ulong)((int)uVar4 <= (int)puVar14[1]) + lVar12;
            abStack_81[lVar12 + 1] = bVar6 + 2;
            lVar12 = (ulong)((int)uVar4 <= (int)puVar14[2]) + lVar12;
            abStack_81[lVar12 + 1] = bVar6 + 3;
            lVar12 = (ulong)((int)uVar4 <= (int)puVar14[3]) + lVar12;
            abStack_81[lVar12 + 1] = bVar6 + 4;
            lVar12 = (ulong)((int)uVar4 <= (int)puVar14[4]) + lVar12;
            abStack_81[lVar12 + 1] = bVar6 + 5;
            lVar12 = (ulong)((int)uVar4 <= (int)puVar14[5]) + lVar12;
            abStack_81[lVar12 + 1] = bVar6 + 6;
            lVar12 = (ulong)((int)uVar4 <= (int)puVar14[6]) + lVar12;
            abStack_81[lVar12 + 1] = bVar6 + 7;
            uVar11 = (ulong)((int)uVar4 <= (int)puVar14[7]) + lVar12;
            puVar14 = puVar14 + 8;
            bVar18 = bVar6 < 0x38;
            bVar6 = bVar6 + 8;
          } while (bVar18);
        }
        if (uVar8 < 0x40) {
          if (uVar8 != 0) {
            bVar6 = 0;
            puVar15 = puVar13;
            do {
              bVar6 = bVar6 + 1;
              pbVar10[uVar17] = bVar6;
              puVar13 = puVar15 + -1;
              uVar17 = uVar17 + ((int)puVar15[-1] < (int)uVar4);
              puVar15 = puVar13;
            } while (bVar6 < (byte)uVar8);
          }
        }
        else {
          bVar6 = 0xf8;
          puVar15 = puVar13;
          do {
            pbVar10[uVar17] = bVar6 + 9;
            lVar12 = ((int)puVar15[-1] < (int)uVar4) + uVar17;
            pbVar10[lVar12] = bVar6 + 10;
            lVar12 = (ulong)((int)puVar15[-2] < (int)uVar4) + lVar12;
            pbVar10[lVar12] = bVar6 + 0xb;
            lVar12 = (ulong)((int)puVar15[-3] < (int)uVar4) + lVar12;
            pbVar10[lVar12] = bVar6 + 0xc;
            lVar12 = (ulong)((int)puVar15[-4] < (int)uVar4) + lVar12;
            pbVar10[lVar12] = bVar6 + 0xd;
            lVar12 = (ulong)((int)puVar15[-5] < (int)uVar4) + lVar12;
            pbVar10[lVar12] = bVar6 + 0xe;
            lVar12 = (ulong)((int)puVar15[-6] < (int)uVar4) + lVar12;
            pbVar10[lVar12] = bVar6 + 0xf;
            lVar12 = (ulong)((int)puVar15[-7] < (int)uVar4) + lVar12;
            pbVar10[lVar12] = bVar6 + 0x10;
            puVar13 = puVar15 + -8;
            uVar17 = (ulong)((int)puVar15[-8] < (int)uVar4) + lVar12;
            bVar6 = bVar6 + 8;
            puVar15 = puVar13;
          } while (bVar6 < 0x38);
        }
        uVar9 = uVar11;
        if (uVar17 < uVar11) {
          uVar9 = uVar17;
        }
        pbVar2 = abStack_81 + lVar7 + 1;
        pbVar3 = pbVar10 + (long)param_3;
        if (uVar11 == uVar17) {
          if (uVar9 != 0) {
            uVar8 = 0;
            do {
              bVar6 = pbVar3[uVar8];
              uVar5 = puVar16[pbVar2[uVar8]];
              puVar16[pbVar2[uVar8]] = local_180[-(ulong)bVar6];
              local_180[-(ulong)bVar6] = uVar5;
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
        }
        else if (uVar9 != 0) {
          puVar15 = local_180 + -(ulong)*pbVar3;
          uVar5 = puVar16[*pbVar2];
          puVar16[*pbVar2] = *puVar15;
          if (uVar9 != 1) {
            uVar8 = 1;
            do {
              bVar6 = pbVar2[uVar8];
              *puVar15 = puVar16[bVar6];
              puVar15 = local_180 + -(ulong)pbVar3[uVar8];
              puVar16[bVar6] = *puVar15;
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          *puVar15 = uVar5;
        }
        uVar8 = uVar11 - uVar9;
        lVar7 = lVar7 + uVar9;
        param_3 = (uint *)((long)param_3 + uVar9);
        if (uVar11 <= uVar17) {
          lVar7 = 0;
          puVar16 = puVar14;
        }
        uVar17 = uVar17 - uVar9;
        if (uVar17 == 0) {
          param_3 = (uint *)0x0;
          local_180 = puVar13;
        }
        uVar11 = uVar8;
      } while (puVar14 < puVar13);
      for (; uVar8 != 0; uVar8 = uVar8 - 1) {
        puVar14 = puVar13 + -1;
        uVar5 = puVar16[abStack_81[uVar8 + lVar7]];
        puVar16[abStack_81[uVar8 + lVar7]] = puVar13[-1];
        puVar13[-1] = uVar5;
        puVar13 = puVar14;
      }
      if (uVar17 != 0) {
        pbVar10 = local_101 + (long)param_3;
        puVar13 = puVar14;
        do {
          param_3 = local_180 + -(ulong)pbVar10[uVar17];
          puVar14 = puVar13 + 1;
          uVar5 = *param_3;
          *param_3 = *puVar13;
          *puVar13 = uVar5;
          uVar17 = uVar17 - 1;
          puVar13 = puVar14;
        } while (uVar17 != 0);
      }
    }
  }
  pVar19._9_7_ = (undefined7)((ulong)param_3 >> 8);
  pVar19.second = end <= puVar1;
  *begin = puVar14[-1];
  puVar14[-1] = uVar4;
  pVar19.first._M_current = (int *)(puVar14 + -1);
  return pVar19;
}

Assistant:

std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {

  typedef typename std::iterator_traits<Iter>::value_type T;

  constexpr size_t block_size = 64;
  constexpr size_t cacheline_size = 64;

  // Move pivot into local for speed.
  T pivot(std::move(*begin));
  Iter first = begin;
  Iter last = end;

  // Find the first element greater than or equal than the pivot (the median of 3 guarantees
  // this exists).
  while (comp(*++first, pivot));

  // Find the first element strictly smaller than the pivot. We have to guard this search if
  // there was no element before *first.
  if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
  else                    while (                !comp(*--last, pivot));

  // If the first pair of elements that should be swapped to partition are the same element,
  // the passed in sequence already was correctly partitioned.
  bool already_partitioned = first >= last;
  if (!already_partitioned) {
    std::iter_swap(first, last);
    ++first;

    // The following branchless partitioning is derived from "BlockQuicksort: How Branch
    // Mispredictions don't affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
    // heavily micro-optimized.
    unsigned char offsets_l_storage[block_size + cacheline_size];
    unsigned char offsets_r_storage[block_size + cacheline_size];
    unsigned char* offsets_l = align_cacheline(offsets_l_storage);
    unsigned char* offsets_r = align_cacheline(offsets_r_storage);

    Iter offsets_l_base = first;
    Iter offsets_r_base = last;
    size_t num_l, num_r, start_l, start_r;
    num_l = num_r = start_l = start_r = 0;

    while (first < last) {
      // Fill up offset blocks with elements that are on the wrong side.
      // First we determine how much elements are considered for each offset block.
      size_t num_unknown = last - first;
      size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
      size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

      // Fill the offset blocks.
      if (left_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      } else {
        for (unsigned char i = 0; i < left_split;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      }

      if (right_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      } else {
        for (unsigned char i = 0; i < right_split;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      }

      // Swap elements and update block sizes and first/last boundaries.
      size_t num = std::min(num_l, num_r);
      swap_offsets(
        offsets_l_base, offsets_r_base, 
        offsets_l + start_l, offsets_r + start_r,
        num, num_l == num_r
      );
      num_l -= num; num_r -= num;
      start_l += num; start_r += num;

      if (num_l == 0) {
        start_l = 0;
        offsets_l_base = first;
      }

      if (num_r == 0) {
        start_r = 0;
        offsets_r_base = last;
      }
    }

    // We have now fully identified [first, last)'s proper position. Swap the last elements.
    if (num_l) {
      offsets_l += start_l;
      while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
      first = last;
    }
    if (num_r) {
      offsets_r += start_r;
      while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
      last = first;
    }
  }

  // Put the pivot in the right place.
  Iter pivot_pos = first - 1;
  *begin = std::move(*pivot_pos);
  *pivot_pos = std::move(pivot);

  return std::make_pair(pivot_pos, already_partitioned);
}